

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O0

void __thiscall PropertyParser::parseLinkProperty(PropertyParser *this,int type,string *linkName)

{
  int iVar1;
  undefined4 extraout_var;
  InputError *this_00;
  string local_48 [32];
  Link *local_28;
  Link *link;
  string *linkName_local;
  PropertyParser *pPStack_10;
  int type_local;
  PropertyParser *this_local;
  
  link = (Link *)linkName;
  linkName_local._4_4_ = type;
  pPStack_10 = this;
  iVar1 = Network::link((this->super_InputParser).network,(char *)linkName,(char *)linkName);
  local_28 = (Link *)CONCAT44(extraout_var,iVar1);
  if (local_28 != (Link *)0x0) {
    switch(linkName_local._4_4_) {
    case 0:
      LinkParser::parseStatus((LinkParser *)&this->field_0x11,local_28,&this->tokens);
      break;
    case 1:
      LinkParser::parseLeakage((LinkParser *)&this->field_0x11,local_28,&this->tokens);
      break;
    case 2:
      LinkParser::parseEnergy
                ((LinkParser *)&this->field_0x11,local_28,(this->super_InputParser).network,
                 &this->tokens);
      break;
    case 3:
      LinkParser::parseReaction((LinkParser *)&this->field_0x11,local_28,0,&this->tokens);
      break;
    case 4:
      LinkParser::parseReaction((LinkParser *)&this->field_0x11,local_28,1,&this->tokens);
    }
    return;
  }
  this_00 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_48,(string *)link);
  InputError::InputError(this_00,5,(string *)local_48);
  __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
}

Assistant:

void PropertyParser::parseLinkProperty(int type, string& linkName)
{
    Link* link = network->link(linkName);
    if ( link == nullptr ) throw InputError(InputError::UNDEFINED_OBJECT, linkName);
    switch (type)
    {
        case STATUS:  linkParser.parseStatus(link, tokens);               break;
        case LEAKAGE: linkParser.parseLeakage(link, tokens);              break;
        case ENERGY:  linkParser.parseEnergy(link, network, tokens);      break;
        case BULK:    linkParser.parseReaction(link, Link::BULK, tokens); break;
        case WALL:    linkParser.parseReaction(link, Link::WALL, tokens); break;
    }
}